

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O2

bool anon_unknown.dwarf_3835::test_derivative_random
               (string *str,string *derivative_str,uint32_t var_id,double xmin,double xmax)

{
  uint uVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  result_type_conflict1 rVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Expr diff;
  Expr expect;
  Expr expr;
  uniform_real_distribution<double> unif;
  
  nivalis::parse(&expr,str,(Environment *)&(anonymous_namespace)::env,true,false,0,(string *)0x0);
  nivalis::parse(&expect,derivative_str,(Environment *)&(anonymous_namespace)::env,true,false,0,
                 (string *)0x0);
  iVar3 = 0;
  nivalis::Expr::diff(&diff,&expr,0,(Environment *)&(anonymous_namespace)::env);
  iVar4 = 1000;
  unif._M_param._M_a = xmin;
  unif._M_param._M_b = xmax;
  do {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      if (iVar3 != 1000) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Derivative equiv test fail\ndiff   ");
        poVar2 = nivalis::operator<<(poVar2,&diff);
        poVar2 = std::operator<<(poVar2,"\nexpect ");
        poVar2 = nivalis::operator<<(poVar2,&expect);
        std::operator<<(poVar2,"\n");
      }
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&diff);
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&expect);
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&expr);
      return iVar3 == 1000;
    }
    rVar6 = std::uniform_real_distribution<double>::operator()
                      (&unif,(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                              *)&nivalis::test::(anonymous_namespace)::reng);
    *(anonymous_namespace)::env = rVar6;
    dVar7 = nivalis::Expr::operator()(&diff,(Environment *)&(anonymous_namespace)::env);
    dVar8 = nivalis::Expr::operator()(&expect,(Environment *)&(anonymous_namespace)::env);
    if (NAN(dVar7)) {
      uVar1 = 1;
      if (!NAN(dVar8)) goto LAB_00107106;
    }
    else {
LAB_00107106:
      dVar9 = ABS(dVar7 - dVar8);
      dVar7 = ABS((dVar7 - dVar8) / dVar7);
      if (dVar9 <= dVar7) {
        dVar7 = dVar9;
      }
      uVar1 = (uint)(dVar7 < 1e-06);
    }
    iVar3 = iVar3 + uVar1;
  } while( true );
}

Assistant:

bool test_derivative_random(
            const std::string& str,
            const std::string& derivative_str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        Expr expr = parse(str, env);
        Expr expect = parse(derivative_str, env);
        Expr diff = expr.diff(var_id, env);
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double dfx = diff(env);
            double dfx_expect = expect(env);
            if (std::isnan(dfx) && std::isnan(dfx_expect)) ++cnt;
            else cnt += (absrelerr(dfx, dfx_expect) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Derivative equiv test fail\ndiff   " << diff <<
                "\nexpect " << expect << "\n";
            return false;
        }
        return true;
    }